

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping.cpp
# Opt level: O3

void test_2d_dynamic<1ul,5ul,1ul,30ul>(void)

{
  undefined8 uVar1;
  allocator_type *paVar2;
  int *t;
  long lVar3;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  allocator_type *local_70;
  allocator_type *local_68;
  vector<int,_std::allocator<int>_> local_60;
  pointer local_48;
  long local_40;
  pointer local_38;
  
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_68 = (allocator_type *)CONCAT71(local_68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x10f,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&local_60
             ,(bool *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_68._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x111,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(int *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_68 = (allocator_type *)CONCAT44(local_68._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x112,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(int *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  local_68 = (allocator_type *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x114,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  local_68 = (allocator_type *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x115,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_68 = (allocator_type *)CONCAT71(local_68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x11b,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&local_60
             ,(bool *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_68 = (allocator_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x11d,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  local_68 = (allocator_type *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x11e,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x6;
  local_68 = (allocator_type *)0x6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x120,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  local_68 = (allocator_type *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x121,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_60,(unsigned_long *)&local_68);
  local_68 = (allocator_type *)CONCAT44(local_68._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,0x1e,(value_type_conflict1 *)&local_68,(allocator_type *)&local_70);
  lVar3 = 0;
  local_48 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  paVar2 = (allocator_type *)0x0;
  do {
    local_70 = paVar2;
    local_68 = paVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x12e,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_70,(unsigned_long *)&local_68);
    t = (int *)(lVar3 + (long)local_48);
    local_38 = local_48 + (long)local_68;
    local_70 = (allocator_type *)t;
    local_40 = lVar3;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x130,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
               (int **)&local_70,&local_38);
    *t = 0x11;
    local_70._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x134,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",t,
               (int *)&local_70);
    lVar3 = local_40;
    if ((allocator_type *)
        ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) <= paVar2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",paVar2)
      ;
      paVar2 = (allocator_type *)&local_70;
      goto LAB_0010b975;
    }
    local_70 = (allocator_type *)CONCAT44(local_70._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(sub_l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x137,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
               (int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + local_40),(int *)&local_70);
    paVar2 = paVar2 + 5;
    lVar3 = lVar3 + 0x14;
  } while (paVar2 != (allocator_type *)&DAT_0000001e);
  lVar3 = 0;
  paVar2 = (allocator_type *)0x0;
  do {
    local_70 = paVar2;
    local_68 = paVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x140,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_70,(unsigned_long *)&local_68);
    if ((allocator_type *)(((ulong)paVar2 / 5) * 5) == paVar2) {
      local_70._0_4_ = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x147,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)local_48 + lVar3),(int *)&local_70);
      if ((allocator_type *)
          ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) <= paVar2) goto LAB_0010b975;
      local_70 = (allocator_type *)CONCAT44(local_70._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x14a,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3),(int *)&local_70);
    }
    else {
      local_70._0_4_ = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x14f,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)local_48 + lVar3),(int *)&local_70);
      if ((allocator_type *)
          ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) <= paVar2) {
LAB_0010b975:
        uVar1 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,paVar2);
        if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar1);
      }
      local_70 = (allocator_type *)CONCAT44(local_70._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x152,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3),(int *)&local_70);
    }
    paVar2 = paVar2 + 1;
    lVar3 = lVar3 + 4;
    if (paVar2 == (allocator_type *)&DAT_0000001e) {
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_2d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0>
    > const l{{X, Y}, {1, 1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0> 
    > const sub_l{{X / N, Y / M}, {N, M}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    // Initialize all elements to 42.
    std::vector<int> data(l[0] * l[1], 42);
    int* dptr = data.data();

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.steps()[0]))
           && (0 == (j % sub_l.steps()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
        }
    }
}